

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseRange<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,SizeType *range)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  undefined7 extraout_var;
  Range *pRVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint codepoint;
  uint local_54;
  uint local_50;
  uint local_4c;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
  *local_48;
  Stack<rapidjson::CrtAllocator> *local_40;
  SizeType *local_38;
  
  uVar8 = ds->codepoint_;
  iVar7 = 0;
  if (uVar8 != 0) {
    puVar1 = &ds->codepoint_;
    local_40 = (Stack<rapidjson::CrtAllocator> *)(this + 0x40);
    uVar9 = 0xffffffff;
    bVar5 = 1;
    local_50 = 0xffffffff;
    local_4c = 0;
    local_48 = ds;
    local_38 = range;
    do {
      bVar3 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                        (local_48->ss_,puVar1);
      uVar2 = local_50;
      if (!bVar3) {
        *puVar1 = 0;
      }
      local_54 = uVar8;
      if ((bool)(bVar5 & uVar8 == 0x5e)) {
        local_4c = (uint)CONCAT71(extraout_var,1);
        uVar8 = *puVar1;
      }
      else {
        if (uVar8 == 0x5c) {
          if (*puVar1 == 0x62) {
            bVar3 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (local_48->ss_,puVar1);
            if (!bVar3) {
              *puVar1 = 0;
            }
            local_54 = 8;
          }
          else {
            bVar3 = CharacterEscape<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (this,local_48,&local_54);
            if (!bVar3) {
              return false;
            }
          }
        }
        else if (uVar8 == 0x5d) {
          uVar6 = (ulong)local_50;
          if (local_50 == 0xffffffff) {
            return false;
          }
          if (iVar7 == 2) {
            pRVar4 = Stack<rapidjson::CrtAllocator>::
                     Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Range>
                               (local_40,1);
            pRVar4->start = 0x2d;
            pRVar4->end = 0x2d;
            pRVar4->next = 0xffffffff;
            iVar7 = *(int *)(this + 0x78);
            uVar8 = iVar7 + 1;
            *(uint *)(this + 0x78) = uVar8;
            if (uVar9 == 0xffffffff) {
              __assert_fail("current != kRegexInvalidRange",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                            ,0x1f8,
                            "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::ParseRange(DecodedStream<InputStream, Encoding> &, SizeType *) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                           );
            }
            if (uVar8 <= uVar9) goto LAB_0013ea0d;
            *(int *)(*(long *)(this + 0x50) + 8 + (ulong)uVar9 * 0xc) = iVar7;
          }
          if ((local_4c & 1) == 0) {
LAB_0013e9f4:
            *local_38 = uVar2;
            return true;
          }
          if (uVar2 < *(uint *)(this + 0x78)) {
            puVar1 = (uint *)(*(long *)(this + 0x50) + uVar6 * 0xc);
            *puVar1 = *puVar1 | 0x80000000;
            goto LAB_0013e9f4;
          }
          goto LAB_0013ea0d;
        }
        uVar8 = local_54;
        if (iVar7 == 2) {
          if (*(uint *)(this + 0x78) <= uVar9) {
LAB_0013ea0d:
            __assert_fail("index < rangeCount_",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                          ,0xb4,
                          "Range &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetRange(SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                         );
          }
          *(uint *)(*(long *)(this + 0x50) + 4 + (ulong)uVar9 * 0xc) = local_54;
          iVar7 = 0;
        }
        else if ((iVar7 != 1) || (iVar7 = 2, local_54 != 0x2d)) {
          pRVar4 = Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Range>
                             (local_40,1);
          pRVar4->end = uVar8;
          pRVar4->start = uVar8;
          pRVar4->next = 0xffffffff;
          uVar8 = *(uint *)(this + 0x78);
          *(uint *)(this + 0x78) = uVar8 + 1;
          if (uVar9 != 0xffffffff) {
            if (uVar8 + 1 <= uVar9) goto LAB_0013ea0d;
            *(uint *)(*(long *)(this + 0x50) + 8 + (ulong)uVar9 * 0xc) = uVar8;
          }
          if (local_50 == 0xffffffff) {
            local_50 = uVar8;
          }
          iVar7 = 1;
          uVar9 = uVar8;
        }
        uVar8 = *puVar1;
      }
      bVar5 = 0;
    } while (uVar8 != 0);
  }
  return false;
}

Assistant:

unsigned Take() {
        unsigned c = codepoint_;
        if (c) // No further decoding when '\0'
            Decode();
        return c;
    }